

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void __thiscall Util::PermuteSudoku(Util *this,char *puzzle,bool pencilmark)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  int row;
  long lVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char cVar9;
  int digit;
  long lVar10;
  size_type __new_size;
  vector<char,_std::allocator<char>_> out_puzzle;
  array<int,_9UL> digit_permutation;
  array<int,_9UL> col_permutation;
  array<int,_9UL> row_permutation;
  char acStack_17c [156];
  undefined8 uStack_e0;
  vector<char,_std::allocator<char>_> local_d8;
  int local_b8 [12];
  array<int,_9UL> local_88;
  array<int,_9UL> local_58;
  
  local_b8[8] = 8;
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_b8[3] = 3;
  local_b8[4] = 4;
  local_b8[5] = 5;
  local_b8[6] = 6;
  local_b8[7] = 7;
  uStack_e0 = 0x105d81;
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (local_b8,local_b8 + 9,&this->rng_);
  local_58._M_elems[8] = 8;
  local_88._M_elems[8] = 8;
  local_58._M_elems[0] = 0;
  local_58._M_elems[1] = 1;
  local_58._M_elems[2] = 2;
  local_58._M_elems[3] = 3;
  local_58._M_elems[4] = 4;
  local_58._M_elems[5] = 5;
  local_58._M_elems[6] = 6;
  local_58._M_elems[7] = 7;
  local_88._M_elems[0] = 0;
  local_88._M_elems[1] = 1;
  local_88._M_elems[2] = 2;
  local_88._M_elems[3] = 3;
  local_88._M_elems[4] = 4;
  local_88._M_elems[5] = 5;
  local_88._M_elems[6] = 6;
  local_88._M_elems[7] = 7;
  uStack_e0 = 0x105db2;
  BlockShuffle(this,&local_88);
  uStack_e0 = 0x105dbd;
  BlockShuffle(this,&local_58);
  __new_size = 0x51;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,pencilmark) != 0) {
    __new_size = 0x2d9;
  }
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uStack_e0 = 0x105de9;
  std::vector<char,_std::allocator<char>_>::resize(&local_d8,__new_size);
  pcVar4 = local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = 0;
  pcVar6 = puzzle;
  do {
    lVar8 = 0;
    pcVar7 = pcVar6;
    do {
      if (pencilmark) {
        iVar2 = local_58._M_elems[lVar5];
        iVar3 = local_88._M_elems[lVar8];
        lVar10 = 0;
        do {
          piVar1 = local_b8 + lVar10;
          cVar9 = (char)*piVar1 + '1';
          if (pcVar7[lVar10] == '.') {
            cVar9 = '.';
          }
          lVar10 = lVar10 + 1;
          local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[*piVar1 + iVar3 * 9 + iVar2 * 0x51] = cVar9;
        } while (lVar10 != 9);
      }
      else {
        cVar9 = '.';
        if ((long)puzzle[lVar8 + lVar5 * 9] != 0x2e) {
          cVar9 = acStack_17c[(long)puzzle[lVar8 + lVar5 * 9] * 4] + '1';
        }
        local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)local_88._M_elems[lVar8] + (long)local_58._M_elems[lVar5] * 9] = cVar9;
      }
      lVar8 = lVar8 + 1;
      pcVar7 = pcVar7 + 9;
    } while (lVar8 != 9);
    lVar5 = lVar5 + 1;
    pcVar6 = pcVar6 + 0x51;
  } while (lVar5 != 9);
  uStack_e0 = 0x105ebd;
  strncpy(puzzle,local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__new_size);
  if (pcVar4 != (char *)0x0) {
    uStack_e0 = 0x105ed2;
    operator_delete(pcVar4,(long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  return;
}

Assistant:

void Util::PermuteSudoku(char *puzzle, bool pencilmark) {
    array<int, 9> digit_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    shuffle(digit_permutation.begin(), digit_permutation.end(), rng_);

    array<int, 9> row_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    array<int, 9> col_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    BlockShuffle(&col_permutation);
    BlockShuffle(&row_permutation);

    size_t row_size = pencilmark ? 81 : 9;
    size_t puzzle_size = row_size * 9;

    vector<char> out_puzzle;
    out_puzzle.resize(puzzle_size);

    for (int row = 0; row < 9; row++) {
        for (int col = 0; col < 9; col++) {
            if (pencilmark) {
                for (int digit = 0; digit < 9; digit++) {
                    bool eliminated = puzzle[row * 81 + col * 9 + digit] == '.';
                    out_puzzle[row_permutation[row] * 81 +
                               col_permutation[col] * 9 +
                               digit_permutation[digit]] =
                            eliminated ? '.' : (char) ('1' + digit_permutation[digit]);
                }
            } else {
                char digit = puzzle[row * 9 + col];
                if (digit != '.') {
                    digit = (char) ('1' + digit_permutation[digit - '1']);
                }
                out_puzzle[row_permutation[row] * 9 + col_permutation[col]] = digit;
            }
        }
    }
    strncpy(puzzle, &out_puzzle[0], puzzle_size);
}